

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack8to4_int8.h
# Opt level: O0

void ncnn::conv1x1s1_sgemm_pack8to4_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Option *opt)

{
  long in_RDI;
  Mat bottom_im2col;
  int size;
  int h;
  int w;
  Option *in_stack_000010c0;
  Mat *in_stack_000010c8;
  Mat *in_stack_000010d0;
  Mat *in_stack_000010d8;
  Mat *in_stack_ffffffffffffff68;
  Mat local_78;
  int local_2c;
  int local_28;
  int local_24;
  
  local_24 = *(int *)(in_RDI + 0x2c);
  local_28 = *(int *)(in_RDI + 0x30);
  local_2c = local_24 * local_28;
  Mat::Mat(&local_78,in_stack_ffffffffffffff68);
  local_78.w = local_2c;
  local_78.h = 1;
  im2col_sgemm_pack8to4_int8_sse
            (in_stack_000010d8,in_stack_000010d0,in_stack_000010c8,in_stack_000010c0);
  Mat::~Mat((Mat *)0x1d4d63);
  return;
}

Assistant:

static void conv1x1s1_sgemm_pack8to4_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    const int size = w * h;

    Mat bottom_im2col = bottom_blob;
    bottom_im2col.w = size;
    bottom_im2col.h = 1;

    im2col_sgemm_pack8to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}